

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall
spdlog::details::async_msg::async_msg
          (async_msg *this,async_logger_ptr *worker,async_msg_type the_type,log_msg *m)

{
  shared_ptr<spdlog::async_logger> *in_RCX;
  undefined4 in_EDX;
  shared_ptr<spdlog::async_logger> *in_RDI;
  
  log_msg_buffer::log_msg_buffer(&this->super_log_msg_buffer,(log_msg *)worker);
  *(undefined4 *)
   &in_RDI[0x18].super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_EDX;
  std::shared_ptr<spdlog::async_logger>::shared_ptr(in_RCX,in_RDI);
  return;
}

Assistant:

async_msg(async_logger_ptr &&worker, async_msg_type the_type, const details::log_msg &m)
        : log_msg_buffer{m},
          msg_type{the_type},
          worker_ptr{std::move(worker)} {}